

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

void __thiscall camp::UserObject::UserObject(UserObject *this,UserObject *copy)

{
  ParentObject *pPVar1;
  ParentObject *obj;
  ParentObject *pPVar2;
  
  this->m_class = copy->m_class;
  std::__shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>,
             &(copy->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>);
  if ((copy->m_parent).px == (ParentObject *)0x0) {
    (this->m_parent).px = (ParentObject *)0x0;
  }
  else {
    pPVar1 = (ParentObject *)operator_new(0x58);
    obj = boost::scoped_ptr<camp::ParentObject>::operator->(&copy->m_parent);
    pPVar2 = boost::scoped_ptr<camp::ParentObject>::operator->(&copy->m_parent);
    ParentObject::ParentObject(pPVar1,&obj->object,pPVar2->member);
    (this->m_parent).px = pPVar1;
    pPVar1 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
    (pPVar1->object).m_child = this;
  }
  return;
}

Assistant:

UserObject::UserObject(const UserObject& copy)
    : m_class(copy.m_class)
    , m_holder(copy.m_holder)
    , m_parent(copy.m_parent ? new ParentObject(copy.m_parent->object, copy.m_parent->member) : 0)
{
    if (m_parent)
        m_parent->object.m_child = this;
}